

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(QPDFFormFieldObjectHelper *this)

{
  Members *__p;
  QPDFObjectHandle local_20;
  
  QPDFObjectHandle::newNull();
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFormFieldObjectHelper_002acfd8;
  __p = (Members *)operator_new(1);
  std::__shared_ptr<QPDFFormFieldObjectHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFFormFieldObjectHelper::Members,void>
            ((__shared_ptr<QPDFFormFieldObjectHelper::Members,(__gnu_cxx::_Lock_policy)2> *)&this->m
             ,__p);
  return;
}

Assistant:

QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper() :
    QPDFObjectHelper(QPDFObjectHandle::newNull()),
    m(new Members())
{
}